

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O3

void __thiscall
t_js_generator::generate_deserialize_container
          (t_js_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int *piVar1;
  pointer pcVar2;
  t_type *type;
  int iVar3;
  ostream *poVar4;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string i;
  string rtmp3;
  string size;
  t_field fsize;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  t_field local_e0;
  
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"_size","");
  t_generator::tmp(&local_240,(t_generator *)this,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"_rtmp3","");
  t_generator::tmp(&local_260,(t_generator *)this,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  type = g_type_i32;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_240._M_dataplus._M_p,
             local_240._M_dataplus._M_p + local_240._M_string_length);
  t_field::t_field(&local_e0,type,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar3 == '\0') goto LAB_002a030f;
      t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = [];",6);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_280,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_280._M_dataplus._M_p,local_280._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(this->js_const_type_)._M_dataplus._M_p,
                          (this->js_const_type_)._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = input.readListBegin();",0x19);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(this->js_const_type_)._M_dataplus._M_p,
                          (this->js_const_type_)._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_240._M_dataplus._M_p,local_240._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,".size || 0;",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = [];",6);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_280,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_280._M_dataplus._M_p,local_280._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(this->js_const_type_)._M_dataplus._M_p,
                          (this->js_const_type_)._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = input.readSetBegin();",0x18);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(this->js_const_type_)._M_dataplus._M_p,
                          (this->js_const_type_)._M_string_length);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_240._M_dataplus._M_p,local_240._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,".size || 0;",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) goto LAB_002a030a;
  }
  else {
    t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = {};",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    paVar6 = &local_2c0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != paVar6) {
      operator_delete(local_2c0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->js_const_type_)._M_dataplus._M_p,
                        (this->js_const_type_)._M_string_length);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_260._M_dataplus._M_p,local_260._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = input.readMapBegin();",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != paVar6) {
      operator_delete(local_2c0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_2c0,(t_generator *)this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(this->js_const_type_)._M_dataplus._M_p,
                        (this->js_const_type_)._M_string_length);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_240._M_dataplus._M_p,local_240._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_260._M_dataplus._M_p,local_260._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".size || 0;",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != paVar6) {
LAB_002a030a:
      operator_delete(local_2c0._M_dataplus._M_p);
    }
  }
LAB_002a030f:
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"_i","");
  t_generator::tmp(&local_2c0,(t_generator *)this,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"for (",5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->js_let_type_)._M_dataplus._M_p,
                      (this->js_let_type_)._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," = 0; ",6);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," < ",3);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; ++",4);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,") {",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar3 != '\0') {
      paVar6 = &local_200.field_2;
      pcVar2 = (prefix->_M_dataplus)._M_p;
      local_200._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_200,pcVar2,pcVar2 + prefix->_M_string_length);
      generate_deserialize_set_element(this,out,(t_set *)ttype,&local_200);
      _Var5._M_p = local_200._M_dataplus._M_p;
      goto LAB_002a079c;
    }
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar3 != '\0') {
      paVar6 = &local_220.field_2;
      pcVar2 = (prefix->_M_dataplus)._M_p;
      local_220._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_220,pcVar2,pcVar2 + prefix->_M_string_length);
      generate_deserialize_list_element(this,out,(t_list *)ttype,&local_220);
      _Var5._M_p = local_220._M_dataplus._M_p;
      goto LAB_002a079c;
    }
  }
  else {
    if (this->gen_node_ == false) {
      t_generator::indent_abi_cxx11_(&local_280,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_280._M_dataplus._M_p,local_280._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if (",4);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," > 0 ) {",8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_2a0,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"  if (input.rstack.length > input.rpos[input.rpos.length -1] + 1) {",0x43);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_180._M_dataplus._M_p,local_180._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    input.rstack.pop();",0x17);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  }",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p);
      }
    }
    paVar6 = &local_1e0.field_2;
    pcVar2 = (prefix->_M_dataplus)._M_p;
    local_1e0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,pcVar2,pcVar2 + prefix->_M_string_length);
    generate_deserialize_map_element(this,out,(t_map *)ttype,&local_1e0);
    _Var5._M_p = local_1e0._M_dataplus._M_p;
LAB_002a079c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar6) {
      operator_delete(_Var5._M_p);
    }
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar3 == '\0') goto LAB_002a085b;
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"input.readListEnd();",0x14);
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"input.readSetEnd();",0x13);
    }
  }
  else {
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"input.readMapEnd();",0x13);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_002a085b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  t_field::~t_field(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_js_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix) {
  string size = tmp("_size");
  string rtmp3 = tmp("_rtmp3");

  t_field fsize(g_type_i32, size);

  // Declare variables, read header
  if (ttype->is_map()) {
    out << indent() << prefix << " = {};" << endl;

    out << indent() << js_const_type_ << rtmp3 << " = input.readMapBegin();" << endl;
    out << indent() << js_const_type_ << size << " = " << rtmp3 << ".size || 0;" << endl;

  } else if (ttype->is_set()) {

    out << indent() << prefix << " = [];" << endl
        << indent() << js_const_type_ << rtmp3 << " = input.readSetBegin();" << endl
        << indent() << js_const_type_ << size << " = " << rtmp3 << ".size || 0;" << endl;

  } else if (ttype->is_list()) {

    out << indent() << prefix << " = [];" << endl
        << indent() << js_const_type_ << rtmp3 << " = input.readListBegin();" << endl
        << indent() << js_const_type_ << size << " = " << rtmp3 << ".size || 0;" << endl;
  }

  // For loop iterates over elements
  string i = tmp("_i");
  indent(out) << "for (" << js_let_type_ << i << " = 0; " << i << " < " << size << "; ++" << i << ") {" << endl;

  indent_up();

  if (ttype->is_map()) {
    if (!gen_node_) {
      out << indent() << "if (" << i << " > 0 ) {" << endl << indent()
          << "  if (input.rstack.length > input.rpos[input.rpos.length -1] + 1) {" << endl
          << indent() << "    input.rstack.pop();" << endl << indent() << "  }" << endl << indent()
          << "}" << endl;
    }

    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix);
  }

  scope_down(out);

  // Read container end
  if (ttype->is_map()) {
    indent(out) << "input.readMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "input.readSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "input.readListEnd();" << endl;
  }
}